

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardFile.cpp
# Opt level: O0

bool __thiscall Diligent::StandardFile::Read(StandardFile *this,void *Data,size_t Size)

{
  Char *Message;
  size_t sVar1;
  size_t BytesRead;
  undefined1 local_48 [8];
  string msg;
  size_t Size_local;
  void *Data_local;
  StandardFile *this_local;
  
  msg.field_2._8_8_ = Size;
  if (this->m_pFile == (FILE *)0x0) {
    FormatString<char[19]>((string *)local_48,(char (*) [19])"File is not opened");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Read",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/StandardFile.cpp"
               ,0x45);
    std::__cxx11::string::~string((string *)local_48);
  }
  if (this->m_pFile == (FILE *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    sVar1 = fread(Data,1,msg.field_2._8_8_,(FILE *)this->m_pFile);
    this_local._7_1_ = sVar1 == msg.field_2._8_8_;
  }
  return this_local._7_1_;
}

Assistant:

bool StandardFile::Read(void* Data, size_t Size)
{
    VERIFY(m_pFile, "File is not opened");
    if (!m_pFile)
        return false;
    auto BytesRead = fread(Data, 1, Size, m_pFile);

    return BytesRead == Size;
}